

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

RTQuaternion __thiscall RTQuaternion::conjugate(RTQuaternion *this)

{
  ulong uVar1;
  RTQuaternion RVar2;
  RTQuaternion local_20;
  undefined1 auVar3 [12];
  
  RTQuaternion(&local_20);
  uVar1 = *(ulong *)(this->m_data + 1) ^ 0x8000000080000000;
  RVar2.m_data[0] = this->m_data[0];
  auVar3._4_4_ = (RTFLOAT)(int)uVar1;
  RVar2.m_data[2] = (RTFLOAT)(int)(uVar1 >> 0x20);
  RVar2.m_data[3] = -this->m_data[3];
  return (RTQuaternion)RVar2.m_data;
}

Assistant:

RTQuaternion RTQuaternion::conjugate() const
{
    RTQuaternion q;
    q.setScalar(m_data[0]);
    q.setX(-m_data[1]);
    q.setY(-m_data[2]);
    q.setZ(-m_data[3]);
    return q;
}